

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O0

void __thiscall
GainContainer::update
          (GainContainer *this,Hypergraph *hypergraph,Partitionment *partitionment,Move move)

{
  uint uVar1;
  uint cell_00;
  bool bVar2;
  PartId PVar3;
  reference pvVar4;
  reference this_00;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar5;
  const_reference pvVar6;
  reference puVar7;
  reference pvVar8;
  reference pvVar9;
  const_iterator cStack_d0;
  uint cell_3;
  const_iterator __end3_3;
  const_iterator __begin3_3;
  value_type *__range3_3;
  const_iterator cStack_b0;
  uint cell_2;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  value_type *__range3_2;
  const_iterator cStack_90;
  uint cell_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  value_type *__range3_1;
  const_iterator cStack_70;
  uint cell;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  const_iterator cStack_50;
  uint net;
  const_iterator __end1;
  const_iterator __begin1;
  value_type *__range1;
  value_type *cell_state;
  Partitionment *partitionment_local;
  Hypergraph *hypergraph_local;
  GainContainer *this_local;
  Move move_local;
  
  pvVar4 = std::vector<GainContainer::CellState,_std::allocator<GainContainer::CellState>_>::
           operator[](&this->cell_states_,(ulong)move & 0xffffffff);
  this_local._4_1_ = move.src;
  this_00 = std::vector<GainBuckets,_std::allocator<GainBuckets>_>::operator[]
                      (&this->buckets_,(ulong)(this_local._4_1_ & 1));
  GainBuckets::delCell(this_00,pvVar4->gain,(pvVar4->iter)._M_node);
  pvVar4->locked = true;
  pvVar5 = Hypergraph::getCells(hypergraph);
  pvVar6 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator[](pvVar5,(ulong)move & 0xffffffff);
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar6);
  cStack_50 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar6);
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb0), bVar2) {
    puVar7 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    uVar1 = *puVar7;
    pvVar8 = std::
             vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ::operator[](&this->num_cells_in_partitions_,(ulong)uVar1);
    this_local._5_1_ = move.dst;
    pvVar9 = std::array<unsigned_int,_2UL>::operator[](pvVar8,(ulong)(this_local._5_1_ & 1));
    this_local._0_4_ = move.cell;
    if (*pvVar9 == 0) {
      pvVar5 = Hypergraph::getNets(hypergraph);
      pvVar6 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](pvVar5,(ulong)uVar1);
      __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar6);
      cStack_70 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar6);
      while (bVar2 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff90), bVar2) {
        puVar7 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end3);
        if (*puVar7 != (uint)this_local) {
          updateGain(this,*puVar7,(PartId)(this_local._4_1_ & 1),1);
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end3);
      }
    }
    pvVar8 = std::
             vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ::operator[](&this->num_cells_in_partitions_,(ulong)uVar1);
    pvVar9 = std::array<unsigned_int,_2UL>::operator[](pvVar8,(ulong)(this_local._5_1_ & 1));
    if (*pvVar9 == 1) {
      pvVar5 = Hypergraph::getNets(hypergraph);
      pvVar6 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](pvVar5,(ulong)uVar1);
      __end3_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar6);
      cStack_90 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar6);
      while (bVar2 = __gnu_cxx::operator!=(&__end3_1,&stack0xffffffffffffff70), bVar2) {
        puVar7 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end3_1);
        cell_00 = *puVar7;
        if ((cell_00 != (uint)this_local) &&
           (PVar3 = Partitionment::operator[](partitionment,cell_00),
           PVar3 == (PartId)(this_local._5_1_ & 1U))) {
          updateGain(this,cell_00,(PartId)(this_local._5_1_ & 1),-1);
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end3_1);
      }
    }
    pvVar8 = std::
             vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ::operator[](&this->num_cells_in_partitions_,(ulong)uVar1);
    pvVar9 = std::array<unsigned_int,_2UL>::operator[](pvVar8,(ulong)(this_local._4_1_ & 1));
    *pvVar9 = *pvVar9 - 1;
    pvVar8 = std::
             vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ::operator[](&this->num_cells_in_partitions_,(ulong)uVar1);
    pvVar9 = std::array<unsigned_int,_2UL>::operator[](pvVar8,(ulong)(this_local._5_1_ & 1));
    *pvVar9 = *pvVar9 + 1;
    pvVar8 = std::
             vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ::operator[](&this->num_cells_in_partitions_,(ulong)uVar1);
    pvVar9 = std::array<unsigned_int,_2UL>::operator[](pvVar8,(ulong)(this_local._4_1_ & 1));
    if (*pvVar9 == 0) {
      pvVar5 = Hypergraph::getNets(hypergraph);
      pvVar6 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](pvVar5,(ulong)uVar1);
      __end3_2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar6);
      cStack_b0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar6);
      while (bVar2 = __gnu_cxx::operator!=(&__end3_2,&stack0xffffffffffffff50), bVar2) {
        puVar7 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end3_2);
        if (*puVar7 != (uint)this_local) {
          updateGain(this,*puVar7,(PartId)(this_local._5_1_ & 1),-1);
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end3_2);
      }
    }
    pvVar8 = std::
             vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
             ::operator[](&this->num_cells_in_partitions_,(ulong)uVar1);
    pvVar9 = std::array<unsigned_int,_2UL>::operator[](pvVar8,(ulong)(this_local._4_1_ & 1));
    if (*pvVar9 == 1) {
      pvVar5 = Hypergraph::getNets(hypergraph);
      pvVar6 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator[](pvVar5,(ulong)uVar1);
      __end3_3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar6);
      cStack_d0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar6);
      while (bVar2 = __gnu_cxx::operator!=(&__end3_3,&stack0xffffffffffffff30), bVar2) {
        puVar7 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end3_3);
        uVar1 = *puVar7;
        if ((uVar1 != (uint)this_local) &&
           (PVar3 = Partitionment::operator[](partitionment,uVar1),
           PVar3 == (PartId)(this_local._4_1_ & 1U))) {
          updateGain(this,uVar1,(PartId)(this_local._4_1_ & 1),1);
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end3_3);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void GainContainer::update(const Hypergraph &hypergraph, const Partitionment &partitionment,
                           Move move) {
  auto &cell_state = cell_states_[move.cell];
  buckets_[move.src].delCell(cell_state.gain, cell_state.iter);
  cell_state.locked = true;
  for (unsigned net : hypergraph.getCells()[move.cell]) {
    // updates before move
    if (num_cells_in_partitions_[net][move.dst] == 0) {
      for (unsigned cell : hypergraph.getNets()[net])
        if (cell != move.cell)
          updateGain(cell, move.src, +1);
    }
    if (num_cells_in_partitions_[net][move.dst] == 1) {
      for (unsigned cell : hypergraph.getNets()[net])
        if (cell != move.cell && partitionment[cell] == move.dst)
          updateGain(cell, move.dst, -1);
    }
    // move
    --num_cells_in_partitions_[net][move.src];
    ++num_cells_in_partitions_[net][move.dst];
    // updates after move
    if (num_cells_in_partitions_[net][move.src] == 0) {
      for (unsigned cell : hypergraph.getNets()[net])
        if (cell != move.cell)
          updateGain(cell, move.dst, -1);
    }
    if (num_cells_in_partitions_[net][move.src] == 1) {
      for (unsigned cell : hypergraph.getNets()[net])
        if (cell != move.cell && partitionment[cell] == move.src)
          updateGain(cell, move.src, +1);
    }
  }
}